

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_pivot.cpp
# Opt level: O3

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalPivot::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,LogicalPivot *this)

{
  unsigned_long local_30;
  
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = 0;
  if ((this->bound_pivot).types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->bound_pivot).types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
      emplace_back<unsigned_long&,unsigned_long&>
                ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                 __return_storage_ptr__,&this->pivot_index,&local_30);
      local_30 = local_30 + 1;
    } while (local_30 <
             (ulong)(((long)(this->bound_pivot).types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->bound_pivot).types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalPivot::GetColumnBindings() {
	vector<ColumnBinding> result;
	for (idx_t i = 0; i < bound_pivot.types.size(); i++) {
		result.emplace_back(pivot_index, i);
	}
	return result;
}